

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O2

void data_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations,
                bool include_hwregs,bool include_7e7f)

{
  uint resolve_adress;
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  iterator iVar5;
  uint uVar6;
  _Base_ptr p_Var7;
  uint32_t j;
  ulong uVar8;
  uint local_123c;
  Annotation *data;
  uint local_1224;
  Annotation *local_1220;
  Trace *local_1218;
  AccessIterator readers;
  AccessIterator writers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_readers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_writers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  new_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> new_unknown_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_writers;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_readers;
  set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  global_readers;
  Profile profile;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> global_unknown_writers;
  StringBuilder sb;
  
  local_1218 = trace;
  memset(&sb,0,0x1004);
  profile._msg = "Data report";
  profile._start = clock();
  profile._hide_if_fast = true;
  ReportWriter::writeSeperator(writer,"Data analysis");
  sb._length = 0;
  sb._backing[0] = '\0';
  snestistics::StringBuilder::format(&sb,"DATA RANGE");
  snestistics::StringBuilder::column(&sb,0x14,4);
  snestistics::StringBuilder::format(&sb,"READERS");
  snestistics::StringBuilder::column(&sb,0x3c,4);
  snestistics::StringBuilder::format(&sb,"WRITERS");
  snestistics::StringBuilder::column(&sb,0x5a,4);
  snestistics::StringBuilder::format(&sb,"ANNOTATIONS");
  ReportWriter::writeSeperator(writer,sb._backing);
  global_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &global_readers._M_t._M_impl.super__Rb_tree_header._M_header;
  global_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  global_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header;
  global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  global_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &global_writers._M_t._M_impl.super__Rb_tree_header._M_header;
  global_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  global_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header;
  global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar8 = 0;
  local_1220 = (Annotation *)0x0;
  local_123c = 0xffffffff;
  local_1224 = 0xffffffff;
  global_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       global_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  global_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       global_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_00134ebe:
  pMVar1 = (local_1218->memory_accesses).
           super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if ((ulong)((long)(local_1218->memory_accesses).
                      super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) <= uVar8) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&global_unknown_writers._M_t);
      std::
      _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::~_Rb_tree(&global_writers._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&global_unknown_readers._M_t);
      std::
      _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::~_Rb_tree(&global_readers._M_t);
      snestistics::Profile::~Profile(&profile);
      return;
    }
    resolve_adress = pMVar1[uVar8].adress;
    if ((resolve_adress & 0xfe0000) == 0x7e0000) {
      if (include_7e7f) break;
    }
    else if (((resolve_adress & 0xfc00) - 0x4400 < 0xffffdc00) || (include_hwregs)) break;
    uVar8 = (ulong)((int)uVar8 + 1);
  } while( true );
  data = (Annotation *)0x0;
  new_readers._M_t._M_impl._0_8_ = 0;
  snestistics::AnnotationResolver::resolve_annotation
            (annotations,resolve_adress,(Annotation **)&new_readers,&data);
  if (new_readers._M_t._M_impl._0_8_ == 0) {
    new_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    new_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    new_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &new_readers._M_t._M_impl.super__Rb_tree_header._M_header;
    new_readers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header;
    new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    new_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    new_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    new_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &new_writers._M_t._M_impl.super__Rb_tree_header._M_header;
    new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header;
    new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar3 = false;
    new_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         new_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    new_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         new_writers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pMVar1 = (local_1218->memory_accesses).
               super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((ulong)((long)(local_1218->memory_accesses).
                         super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) <= uVar8)
         || (resolve_adress != pMVar1[uVar8].adress)) break;
      uVar6 = pMVar1[uVar8].pc;
      writers._known =
           (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
            *)(CONCAT44(writers._known._4_4_,uVar6) & 0xffffffff7fffffff);
      readers._known =
           (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
            *)0x0;
      snestistics::AnnotationResolver::resolve_annotation
                (annotations,uVar6 & 0x7fffffff,(Annotation **)&readers,(Annotation **)0x0);
      if (readers._known ==
          (set<const_snestistics::Annotation_*,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
           *)0x0) {
        if ((int)uVar6 < 0) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&new_unknown_writers,(uint *)&writers);
          if (!bVar3) {
            iVar5._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&new_unknown_writers._M_t,(key_type *)&writers);
            p_Var7 = &new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_header;
            goto LAB_00135174;
          }
        }
        else {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&new_unknown_readers,(uint *)&writers);
          if (!bVar3) {
            iVar5._M_node =
                 (_Base_ptr)
                 std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&global_unknown_readers._M_t,(key_type *)&writers);
            p_Var7 = &global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_header;
            goto LAB_00135174;
          }
        }
      }
      else if ((int)uVar6 < 0) {
        std::
        _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
        ::_M_insert_unique<snestistics::Annotation_const*const&>
                  ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                    *)&new_writers,(Annotation **)&readers);
        if (!bVar3) {
          iVar5 = std::
                  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                  ::find(&global_writers._M_t,(key_type *)&readers);
          p_Var7 = &global_writers._M_t._M_impl.super__Rb_tree_header._M_header;
          goto LAB_00135174;
        }
      }
      else {
        std::
        _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
        ::_M_insert_unique<snestistics::Annotation_const*const&>
                  ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                    *)&new_readers,(Annotation **)&readers);
        if (!bVar3) {
          iVar5 = std::
                  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                  ::find(&global_readers._M_t,(key_type *)&readers);
          p_Var7 = &global_readers._M_t._M_impl.super__Rb_tree_header._M_header;
LAB_00135174:
          if (iVar5._M_node == p_Var7) {
            bVar3 = true;
          }
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    if (data != local_1220) {
      bVar3 = true;
    }
    if (local_123c != 0xffffffff) {
      if ((new_readers._M_t._M_impl.super__Rb_tree_header._M_node_count !=
           global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count) ||
         (global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          new_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
        bVar3 = true;
      }
      if ((new_writers._M_t._M_impl.super__Rb_tree_header._M_node_count !=
           global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count) ||
         (global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          new_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
        bVar3 = true;
      }
    }
    readers._known = &global_readers;
    readers._unknown = &global_unknown_readers;
    writers._known = &global_writers;
    writers._unknown = &global_unknown_writers;
    writers._current = 0;
    if (bVar3) {
      bVar2 = true;
      do {
        uVar4 = writers._current;
        if ((uint)((int)global_unknown_readers._M_t._M_impl.super__Rb_tree_header._M_node_count +
                  (int)global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count) <=
            writers._current) {
          uVar6 = resolve_adress;
          if ((uint)((int)global_unknown_writers._M_t._M_impl.super__Rb_tree_header._M_node_count +
                    (int)global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count) <=
              writers._current) goto LAB_001353d1;
        }
        sb._length = 0;
        sb._backing[0] = '\0';
        readers._current = writers._current;
        if (bVar2) {
          if (local_123c == local_1224) {
            snestistics::StringBuilder::format(&sb,"%06X",(ulong)local_1224);
          }
          else {
            snestistics::StringBuilder::format(&sb,"%06X-%06X",(ulong)local_123c,(ulong)local_1224);
          }
        }
        if (uVar4 < (uint)((int)global_unknown_readers._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count +
                          (int)global_readers._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
          snestistics::StringBuilder::column(&sb,0x14,4);
          data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
          AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::StringBuilder__
                    (&readers,&sb);
        }
        if (uVar4 < (uint)((int)global_unknown_writers._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count +
                          (int)global_writers._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
          snestistics::StringBuilder::column(&sb,0x3c,4);
          data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
          AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::StringBuilder__
                    (&writers,&sb);
        }
        if ((bool)(bVar2 & local_1220 != (Annotation *)0x0)) {
          snestistics::StringBuilder::column(&sb,0x5a,4);
          snestistics::StringBuilder::format
                    (&sb,"%s [%06X-%06X]",(local_1220->name)._M_dataplus._M_p,
                     (ulong)local_1220->startOfRange,(ulong)local_1220->endOfRange);
        }
        ReportWriter::writeComment(writer,&sb);
        writers._current = uVar4 + 1;
        bVar2 = false;
      } while( true );
    }
    uVar6 = local_123c;
    if (local_123c == 0xffffffff) {
      uVar6 = resolve_adress;
    }
LAB_001353d1:
    readers._current = writers._current;
    if (local_123c == 0xffffffff || bVar3) {
      std::
      _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::swap(&global_readers._M_t,&new_readers._M_t);
      std::
      _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
      ::swap(&global_writers._M_t,&new_writers._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::swap(&global_unknown_readers._M_t,&new_unknown_readers._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::swap(&global_unknown_writers._M_t,&new_unknown_writers._M_t);
      local_1220 = data;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&new_unknown_writers._M_t);
    std::
    _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
    ::~_Rb_tree(&new_writers._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&new_unknown_readers._M_t);
    std::
    _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
    ::~_Rb_tree(&new_readers._M_t);
    local_123c = uVar6;
    local_1224 = resolve_adress;
  }
  else {
    pMVar1 = (local_1218->memory_accesses).
             super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (; (uVar8 < (ulong)((long)(local_1218->memory_accesses).
                                  super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 3) &&
           (resolve_adress == pMVar1[uVar8].adress)); uVar8 = (ulong)((int)uVar8 + 1)) {
    }
  }
  goto LAB_00134ebe;
}

Assistant:

void data_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations, const bool include_hwregs = true, const bool include_7e7f = true) {
	StringBuilder sb;

	Profile profile("Data report", true);
	writer.writeSeperator("Data analysis");

	sb.clear();
	sb.format("DATA RANGE");
	sb.column(20);
	sb.format("READERS");
	sb.column(60);
	sb.format("WRITERS");
	sb.column(90);
	sb.format("ANNOTATIONS");
	writer.writeSeperator(sb.c_str());

	Pointer first_global = INVALID_POINTER, last_global = INVALID_POINTER;

	std::set<const Annotation*> global_readers;
	std::set<uint32_t> global_unknown_readers;
	std::set<const Annotation*> global_writers;
	std::set<uint32_t> global_unknown_writers;
	const Annotation *global_data = nullptr;

	for (uint32_t p = 0; p < trace.memory_accesses.size(); ) {
		const Trace::MemoryAccess ra = trace.memory_accesses[p];
		Pointer adress = ra.adress;

		// This code ignores data reads from WRAM and/or hardware registers (if requested)
		{
			const uint8_t bank = adress>>16;
			const uint32_t bank_less_adress = adress&0xFFFF;
			if (bank == 0x7E || bank == 0x7F) {
				if (!include_7e7f) {
					p++;
					continue;
				}
			} else if (!include_hwregs && bank_less_adress >= 0x2000 && bank_less_adress <= 0x43FF) {
				p++;
				continue;
			}
		}

		const Annotation *data = nullptr;

		// Don't care about accesses to code
		// TODO: Check so we don't write code?
		{
			const Annotation *accessed_function = nullptr;
			annotations.resolve_annotation(adress, &accessed_function, &data);
			if (accessed_function != nullptr) {
				for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
					const Trace::MemoryAccess rb = trace.memory_accesses[j];
					if (adress != rb.adress) break;
				}
				continue;
			}
		}

		bool need_flush = false;
		std::set<const Annotation*> new_readers;
		std::set<uint32_t> new_unknown_readers;
		std::set<const Annotation*> new_writers;
		std::set<uint32_t> new_unknown_writers;

		for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
			const Trace::MemoryAccess rb = trace.memory_accesses[j];
			if (adress != rb.adress) break;

			const bool is_write = (rb.pc & 0x80000000)!=0;
			const Pointer pc = is_write ? rb.pc & ~0x80000000 : rb.pc;

			const Annotation *our_function = nullptr;
			annotations.resolve_annotation(pc, &our_function);

			if (our_function) {
				if (is_write) {
					new_writers.insert(our_function);
					if (!need_flush && global_writers.find(our_function) == global_writers.end()) need_flush = true;
				} else {
					new_readers.insert(our_function);
					if (!need_flush && global_readers.find(our_function) == global_readers.end()) need_flush = true;
				}
			} else {
				if (is_write) {
					new_unknown_writers.insert(pc);
					if (!need_flush && new_unknown_writers.find(pc) == new_unknown_writers.end()) need_flush = true;
				} else {
					new_unknown_readers.insert(pc);
					if (!need_flush && global_unknown_readers.find(pc) == global_unknown_readers.end()) need_flush = true;
				}
			}
		}

		if (data != global_data)
			need_flush = true;

		// We know that we aren't adding any new readers/writers, but did we produce the same full list?
		if (first_global != INVALID_POINTER) {
			if ((new_readers.size() != global_readers.size()) || (global_unknown_readers.size() != new_unknown_readers.size())) {
				need_flush = true;
			}
			if ((new_writers.size() != global_writers.size()) || (global_unknown_writers.size() != new_unknown_writers.size())) {
				need_flush = true;
			}
		}

		bool update_globals = false;
		if (need_flush || first_global == INVALID_POINTER) {
			update_globals = true;
		}

		struct AccessIterator {
			AccessIterator(const std::set<const Annotation*> &known, const std::set<uint32_t> &unknown) : _known(known), _unknown(unknown) {}
			const std::set<const Annotation*> &_known;
			const std::set<uint32_t> &_unknown;

			uint32_t _current = 0;
			bool has() {
				const uint32_t total = (uint32_t)_known.size() + (uint32_t)_unknown.size();
				return _current < total;
			}
			void advance() {
				_current++;
			}
			void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}
		};

		AccessIterator readers(global_readers, global_unknown_readers);
		AccessIterator writers(global_writers, global_unknown_writers);

		// If last range was finished, print it
		if (need_flush) {
			bool first_line = true;
			while (readers.has() || writers.has()) {
				sb.clear();
				if (first_line) {
					if (first_global != last_global)
						sb.format("%06X-%06X", first_global, last_global);
					else
						sb.format("%06X", first_global);
				}
				if (readers.has()) {
					sb.column(20);
					readers.emit(sb);
				}
				if (writers.has()) {
					sb.column(60);
					writers.emit(sb);
				}
				if (first_line) {
					if (global_data) {
						sb.column(90);
						sb.format("%s [%06X-%06X]", global_data->name.c_str(), global_data->startOfRange, global_data->endOfRange);
					}
				}
				writer.writeComment(sb);
				first_line = false;
				readers.advance();
				writers.advance();
			}
			first_global = last_global = adress;
		} else {
			if (first_global == INVALID_POINTER) first_global = adress;
			last_global = adress;
		}
		
		if (update_globals) {
			std::swap(global_readers, new_readers);
			std::swap(global_writers, new_writers);
			std::swap(global_unknown_readers, new_unknown_readers);
			std::swap(global_unknown_writers, new_unknown_writers);
			global_data = data;
		}
	}

	// TODO: Print last range
}